

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sexp_conflict
sexp_readlink_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                  sexp_conflict arg1,sexp_conflict arg2)

{
  size_t __len;
  ssize_t sVar1;
  sexp_conflict psVar2;
  undefined8 uVar3;
  
  if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 9)) {
    if ((((ulong)arg1 & 3) == 0) && (arg1->tag == 9)) {
      if ((((ulong)arg2 & 1) != 0) || ((((ulong)arg2 & 2) == 0 && (arg2->tag == 0xc)))) {
        if (((ulong)arg2 & 1) == 0) {
          if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
            __len = (long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length;
          }
          else {
            __len = 0;
          }
        }
        else {
          __len = (long)arg2 >> 1;
        }
        sVar1 = readlink((((arg0->value).type.cpl)->value).flonum_bits +
                         (long)(((arg0->value).type.name)->value).flonum_bits,
                         (((arg1->value).type.cpl)->value).flonum_bits +
                         (long)(((arg1->value).type.name)->value).flonum_bits,__len);
        psVar2 = (sexp_conflict)sexp_make_integer(ctx,sVar1,sVar1 >> 0x3f);
        return psVar2;
      }
      uVar3 = 2;
    }
    else {
      uVar3 = 9;
      arg2 = arg1;
    }
  }
  else {
    uVar3 = 9;
    arg2 = arg0;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,uVar3,arg2);
  return psVar2;
}

Assistant:

sexp sexp_readlink_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_stringp(arg1))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  res = sexp_make_integer(ctx, readlink(sexp_string_data(arg0), sexp_string_data(arg1), sexp_sint_value(arg2)));
  return res;
}